

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

void cram_free_slice(cram_slice *s)

{
  kh_m_s2i_t *pkVar1;
  cram_block **__ptr;
  long lVar2;
  
  if (s != (cram_slice *)0x0) {
    if (s->hdr_block != (cram_block *)0x0) {
      cram_free_block(s->hdr_block);
    }
    __ptr = s->block;
    if (__ptr != (cram_block **)0x0) {
      if ((s->hdr != (cram_block_slice_hdr *)0x0) && (0 < s->hdr->num_blocks)) {
        lVar2 = 0;
        do {
          cram_free_block(s->block[lVar2]);
          lVar2 = lVar2 + 1;
        } while (lVar2 < s->hdr->num_blocks);
        __ptr = s->block;
      }
      free(__ptr);
    }
    if (s->block_by_id != (cram_block **)0x0) {
      free(s->block_by_id);
    }
    if (s->hdr != (cram_block_slice_hdr *)0x0) {
      cram_free_slice_header(s->hdr);
    }
    if (s->seqs_blk != (cram_block *)0x0) {
      cram_free_block(s->seqs_blk);
    }
    if (s->qual_blk != (cram_block *)0x0) {
      cram_free_block(s->qual_blk);
    }
    if (s->name_blk != (cram_block *)0x0) {
      cram_free_block(s->name_blk);
    }
    if (s->aux_blk != (cram_block *)0x0) {
      cram_free_block(s->aux_blk);
    }
    if (s->aux_OQ_blk != (cram_block *)0x0) {
      cram_free_block(s->aux_OQ_blk);
    }
    if (s->aux_BQ_blk != (cram_block *)0x0) {
      cram_free_block(s->aux_BQ_blk);
    }
    if (s->aux_FZ_blk != (cram_block *)0x0) {
      cram_free_block(s->aux_FZ_blk);
    }
    if (s->aux_oq_blk != (cram_block *)0x0) {
      cram_free_block(s->aux_oq_blk);
    }
    if (s->aux_os_blk != (cram_block *)0x0) {
      cram_free_block(s->aux_os_blk);
    }
    if (s->aux_oz_blk != (cram_block *)0x0) {
      cram_free_block(s->aux_oz_blk);
    }
    if (s->base_blk != (cram_block *)0x0) {
      cram_free_block(s->base_blk);
    }
    if (s->soft_blk != (cram_block *)0x0) {
      cram_free_block(s->soft_blk);
    }
    if (s->cigar != (uint32_t *)0x0) {
      free(s->cigar);
    }
    if (s->crecs != (cram_record *)0x0) {
      free(s->crecs);
    }
    if (s->features != (cram_feature *)0x0) {
      free(s->features);
    }
    if (s->TN != (uint32_t *)0x0) {
      free(s->TN);
    }
    if (s->pair_keys != (string_alloc_t *)0x0) {
      string_pool_destroy(s->pair_keys);
    }
    pkVar1 = s->pair[0];
    if (pkVar1 != (kh_m_s2i_t *)0x0) {
      free(pkVar1->keys);
      free(pkVar1->flags);
      free(pkVar1->vals);
      free(pkVar1);
    }
    pkVar1 = s->pair[1];
    if (pkVar1 != (kh_m_s2i_t *)0x0) {
      free(pkVar1->keys);
      free(pkVar1->flags);
      free(pkVar1->vals);
      free(pkVar1);
    }
    free(s);
    return;
  }
  return;
}

Assistant:

void cram_free_slice(cram_slice *s) {
    if (!s)
	return;

    if (s->hdr_block)
	cram_free_block(s->hdr_block);

    if (s->block) {
	int i;

	if (s->hdr) {
	    for (i = 0; i < s->hdr->num_blocks; i++) {
		cram_free_block(s->block[i]);
	    }
	}
	free(s->block);
    }

    if (s->block_by_id)
	free(s->block_by_id);

    if (s->hdr)
	cram_free_slice_header(s->hdr);

    if (s->seqs_blk)
	cram_free_block(s->seqs_blk);

    if (s->qual_blk)
	cram_free_block(s->qual_blk);

    if (s->name_blk)
	cram_free_block(s->name_blk);

    if (s->aux_blk)
	cram_free_block(s->aux_blk);

    if (s->aux_OQ_blk)
	cram_free_block(s->aux_OQ_blk);

    if (s->aux_BQ_blk)
	cram_free_block(s->aux_BQ_blk);

    if (s->aux_FZ_blk)
	cram_free_block(s->aux_FZ_blk);

    if (s->aux_oq_blk)
	cram_free_block(s->aux_oq_blk);

    if (s->aux_os_blk)
	cram_free_block(s->aux_os_blk);

    if (s->aux_oz_blk)
	cram_free_block(s->aux_oz_blk);

    if (s->base_blk)
	cram_free_block(s->base_blk);

    if (s->soft_blk)
	cram_free_block(s->soft_blk);

    if (s->cigar)
	free(s->cigar);

    if (s->crecs)
	free(s->crecs);

    if (s->features)
	free(s->features);

    if (s->TN)
	free(s->TN);

    if (s->pair_keys)
	string_pool_destroy(s->pair_keys);

    if (s->pair[0])
	kh_destroy(m_s2i, s->pair[0]);
    if (s->pair[1])
	kh_destroy(m_s2i, s->pair[1]);

    free(s);
}